

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue JS_ToNumberHintFree(JSContext *ctx,JSValue val,JSToNumberHintEnum flag)

{
  JSValue JVar1;
  JSValue JVar2;
  int iVar3;
  char *pc;
  JSValue v;
  char *local_40;
  size_t len;
  
LAB_0012fe24:
  switch((int)val.tag) {
  case 0:
  case 6:
  case 7:
    return val;
  case 1:
  case 2:
    JVar2.tag = 0;
    JVar2.u.ptr = (void *)((ulong)val.u.ptr & 0xffffffff);
    return JVar2;
  case -8:
    JS_FreeValue(ctx,val);
    JS_ThrowTypeError(ctx,"cannot convert symbol to number");
    goto LAB_0012fef7;
  case -7:
    pc = JS_ToCStringLen(ctx,&len,val);
    JS_FreeValue(ctx,val);
    if (pc != (char *)0x0) {
      iVar3 = skip_spaces(pc);
      local_40 = pc + iVar3;
      if (len == (long)iVar3) {
        v = (JSValue)ZEXT816(0);
      }
      else {
        v = js_atof(ctx,local_40,&local_40,0,4);
        if ((int)v.tag != 6) {
          iVar3 = skip_spaces(local_40);
          local_40 = local_40 + iVar3;
          if ((long)local_40 - (long)pc != len) {
            JS_FreeValue(ctx,v);
            v.tag = 7;
            v.u.float64 = NAN;
          }
        }
      }
      JS_FreeCString(ctx,pc);
      return v;
    }
    return (JSValue)(ZEXT816(6) << 0x40);
  default:
    JS_FreeValue(ctx,val);
  case 3:
    JVar1.tag = 7;
    JVar1.u.float64 = NAN;
    return JVar1;
  case -1:
    break;
  }
  val = JS_ToPrimitiveFree(ctx,val,1);
  if ((int)val.tag == 6) {
LAB_0012fef7:
    return (JSValue)(ZEXT816(6) << 0x40);
  }
  goto LAB_0012fe24;
}

Assistant:

static JSValue JS_ToNumberHintFree(JSContext *ctx, JSValue val,
                                   JSToNumberHintEnum flag)
{
    uint32_t tag;
    JSValue ret;

 redo:
    tag = JS_VALUE_GET_NORM_TAG(val);
    switch(tag) {
#ifdef CONFIG_BIGNUM
    case JS_TAG_BIG_DECIMAL:
        if (flag != TON_FLAG_NUMERIC) {
            JS_FreeValue(ctx, val);
            return JS_ThrowTypeError(ctx, "cannot convert bigdecimal to number");
        }
        ret = val;
        break;
    case JS_TAG_BIG_INT:
        if (flag != TON_FLAG_NUMERIC) {
            JS_FreeValue(ctx, val);
            return JS_ThrowTypeError(ctx, "cannot convert bigint to number");
        }
        ret = val;
        break;
    case JS_TAG_BIG_FLOAT:
        if (flag != TON_FLAG_NUMERIC) {
            JS_FreeValue(ctx, val);
            return JS_ThrowTypeError(ctx, "cannot convert bigfloat to number");
        }
        ret = val;
        break;
#endif
    case JS_TAG_FLOAT64:
    case JS_TAG_INT:
    case JS_TAG_EXCEPTION:
        ret = val;
        break;
    case JS_TAG_BOOL:
    case JS_TAG_NULL:
        ret = JS_NewInt32(ctx, JS_VALUE_GET_INT(val));
        break;
    case JS_TAG_UNDEFINED:
        ret = JS_NAN;
        break;
    case JS_TAG_OBJECT:
        val = JS_ToPrimitiveFree(ctx, val, HINT_NUMBER);
        if (JS_IsException(val))
            return JS_EXCEPTION;
        goto redo;
    case JS_TAG_STRING:
        {
            const char *str;
            const char *p;
            size_t len;
            
            str = JS_ToCStringLen(ctx, &len, val);
            JS_FreeValue(ctx, val);
            if (!str)
                return JS_EXCEPTION;
            p = str;
            p += skip_spaces(p);
            if ((p - str) == len) {
                ret = JS_NewInt32(ctx, 0);
            } else {
                int flags = ATOD_ACCEPT_BIN_OCT;
                ret = js_atof(ctx, p, &p, 0, flags);
                if (!JS_IsException(ret)) {
                    p += skip_spaces(p);
                    if ((p - str) != len) {
                        JS_FreeValue(ctx, ret);
                        ret = JS_NAN;
                    }
                }
            }
            JS_FreeCString(ctx, str);
        }
        break;
    case JS_TAG_SYMBOL:
        JS_FreeValue(ctx, val);
        return JS_ThrowTypeError(ctx, "cannot convert symbol to number");
    default:
        JS_FreeValue(ctx, val);
        ret = JS_NAN;
        break;
    }
    return ret;
}